

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void callFinaliser(sqlite3 *db,int offset)

{
  VTable *pVTab_00;
  sqlite3_vtab *psVar1;
  code *pcVar2;
  _func_int_sqlite3_vtab_ptr *x;
  sqlite3_vtab *p;
  VTable *pVTab;
  int i;
  int offset_local;
  sqlite3 *db_local;
  
  if (db->aVTrans != (VTable **)0x0) {
    for (pVTab._0_4_ = 0; (int)pVTab < db->nVTrans; pVTab._0_4_ = (int)pVTab + 1) {
      pVTab_00 = db->aVTrans[(int)pVTab];
      psVar1 = pVTab_00->pVtab;
      if ((psVar1 != (sqlite3_vtab *)0x0) &&
         (pcVar2 = *(code **)((long)&psVar1->pModule->iVersion + (long)offset),
         pcVar2 != (code *)0x0)) {
        (*pcVar2)(psVar1);
      }
      pVTab_00->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab_00);
    }
    sqlite3DbFree(db,db->aVTrans);
    db->nVTrans = 0;
    db->aVTrans = (VTable **)0x0;
  }
  return;
}

Assistant:

static void callFinaliser(sqlite3 *db, int offset){
  int i;
  if( db->aVTrans ){
    for(i=0; i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      sqlite3_vtab *p = pVTab->pVtab;
      if( p ){
        int (*x)(sqlite3_vtab *);
        x = *(int (**)(sqlite3_vtab *))((char *)p->pModule + offset);
        if( x ) x(p);
      }
      pVTab->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab);
    }
    sqlite3DbFree(db, db->aVTrans);
    db->nVTrans = 0;
    db->aVTrans = 0;
  }
}